

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O3

TValue * trace_exit_cp(lua_State *L,lua_CFunction dummy,void *ud)

{
  byte *pbVar1;
  SnapShot *pSVar2;
  IRIns *pIVar3;
  ushort uVar4;
  ushort uVar5;
  uint32_t uVar6;
  jit_State *J;
  SnapShot *pSVar7;
  SnapEntry *pSVar8;
  ExitState *ex;
  lua_State *L_00;
  lua_State *L_01;
  IRIns *pIVar9;
  uint32_t uVar10;
  SnapShot *pSVar11;
  void *pvVar12;
  GCtab *t;
  IRIns *pIVar13;
  TValue *pTVar14;
  uint8_t *puVar15;
  uint uVar16;
  uint uVar17;
  IRIns *pIVar18;
  ulong uVar19;
  long *plVar20;
  long lVar21;
  IRIns *pIVar22;
  ulong uVar23;
  ulong uVar24;
  byte bVar25;
  BloomFilter rfilt;
  uint ref;
  long lVar26;
  GCtrace *T;
  CTSize CVar27;
  TValue *local_80;
  uint32_t *local_50;
  TValue local_40;
  byte *local_38;
  
  *(undefined4 *)((long)L->cframe + 0x14) = 0xffffffff;
  J = *ud;
  uVar17 = J->exitno;
  T = (GCtrace *)(ulong)J->trace[J->parent].gcptr32;
  pSVar7 = T->snap;
  pSVar2 = pSVar7 + uVar17;
  uVar24 = (ulong)pSVar2->nent;
  pSVar8 = T->snapmap;
  uVar4 = pSVar2->mapofs;
  pSVar11 = (SnapShot *)&T->nsnapmap;
  if (pSVar7 + (ulong)uVar17 + 1 != pSVar7 + T->nsnap) {
    pSVar11 = pSVar7 + (ulong)uVar17 + 1;
  }
  uVar23 = (ulong)(T->nins - 1);
  if (*(char *)((long)T->ir + uVar23 * 8 + 5) == '\x14') {
    pIVar18 = T->ir + uVar23;
    rfilt = 0;
    do {
      if ((pIVar18->field_0).op2 <= uVar17) {
        rfilt = rfilt | 1L << ((ulong)*(byte *)pIVar18 & 0x3f);
      }
      pbVar1 = (byte *)((long)pIVar18 + -3);
      pIVar18 = pIVar18 + -1;
    } while (*pbVar1 == 0x14);
  }
  else {
    rfilt = 0;
  }
  uVar5 = pSVar11->mapofs;
  ex = *(ExitState **)((long)ud + 8);
  local_38 = (byte *)(ulong)pSVar8[uVar4 + uVar24];
  L_00 = J->L;
  *(SnapEntry *)(((ulong)L_00->cframe & 0xfffffffffffffffc) + 0x1c) = pSVar8[uVar4 + uVar24] + 4;
  pTVar14 = L_00->base;
  bVar25 = pSVar2->topslot;
  if ((TValue *)(ulong)(L_00->maxstack).ptr32 <= pTVar14 + bVar25) {
    L_00->top = pTVar14 + *(byte *)((ulong)*(uint *)((ulong)pTVar14[-1].u32.lo + 0x10) - 0x39);
    lj_state_growstack(L_00,(uint)bVar25 -
                            (uint)*(byte *)((ulong)*(uint *)((ulong)pTVar14[-1].u32.lo + 0x10) -
                                           0x39));
    pTVar14 = L_00->base;
  }
  local_80 = pTVar14 + -1;
  if (uVar24 != 0) {
    local_50 = pSVar8 + (uVar5 - 1);
    uVar6 = *(uint32_t *)((long)pTVar14 + -4);
    uVar23 = 0;
    do {
      uVar16 = pSVar8[uVar4 + uVar23];
      if ((uVar16 >> 0x12 & 1) == 0) {
        pTVar14 = local_80 + (uVar16 >> 0x18);
        ref = uVar16 & 0xffff;
        pIVar18 = T->ir;
        if (*(char *)((long)pIVar18 + (ulong)ref * 8 + 6) == -3) {
          if (uVar23 != 0) {
            uVar19 = 0;
            do {
              if ((pSVar8[uVar4 + uVar19] & 0xffff) == ref) {
                *pTVar14 = local_80[pSVar8[uVar4 + uVar19] >> 0x18];
                goto LAB_0011347c;
              }
              uVar19 = uVar19 + 1;
            } while (uVar23 != uVar19);
          }
          pIVar3 = pIVar18 + ref;
          if ((pIVar3->field_1).o - 0x50 < 2) {
            L_01 = J->L;
            plVar20 = (long *)(ulong)*(uint *)((ulong)(L_01->glref).ptr32 + 0xfc);
            plVar20[2] = (long)L_01;
            uVar16 = pIVar18[(pIVar3->field_0).op1].field_1.op12;
            lVar26 = *plVar20;
            lVar21 = (ulong)uVar16 * 0x10;
            CVar27 = 0xffffffff;
            if (*(uint *)(lVar26 + lVar21) < 0x60000000) {
              CVar27 = *(CTSize *)(lVar26 + lVar21 + 4);
            }
            pvVar12 = lj_mem_newgco(L_01,CVar27 + 8);
            *(undefined1 *)((long)pvVar12 + 5) = 10;
            *(short *)((long)pvVar12 + 6) = (short)uVar16;
            (pTVar14->u32).lo = (uint32_t)pvVar12;
            (pTVar14->field_2).it = 0xfffffff5;
            if ((pIVar3->field_1).o == 'Q') {
              snap_restoredata(T,ex,uVar17,rfilt,(uint)(pIVar3->field_0).op2,
                               (void *)((long)pvVar12 + 8),CVar27);
            }
            else {
              uVar5 = T->snap[uVar17].ref;
              pIVar18 = T->ir;
              pIVar9 = pIVar3;
joined_r0x001131cd:
              pIVar9 = pIVar9 + 1;
              if (pIVar9 < pIVar18 + uVar5) {
                if ((pIVar9->field_1).r == 0xfe) {
                  if ((ulong)(pIVar9->field_1).s == 0xff) {
                    uVar16 = (pIVar9->field_1).o - 0x47;
                    if ((4 < uVar16) || (uVar16 == 2)) goto joined_r0x001131cd;
                    pIVar13 = T->ir;
                    uVar19 = (ulong)(pIVar9->field_0).op1;
                    pIVar22 = pIVar13 + uVar19;
                    if (((pIVar22->field_1).o & 0xfe) == 0x38) {
                      pIVar22 = pIVar13 + (pIVar22->field_0).op1;
                    }
                    if (pIVar13 + (pIVar22->field_0).op1 != pIVar3) goto joined_r0x001131cd;
                  }
                  else {
                    if (pIVar9 != pIVar3 + (pIVar9->field_1).s) goto joined_r0x001131cd;
                    pIVar13 = T->ir;
                    uVar19 = (ulong)(pIVar9->field_0).op1;
                  }
                  uVar16._0_2_ = *(IROpT *)((long)pIVar9 + 4);
                  uVar16._2_2_ = *(IRRef1 *)((long)pIVar9 + 6);
                  CVar27 = 8;
                  if ((0x604208U >> (uVar16 & 0x1f) & 1) == 0) {
                    bVar25 = ((byte)(undefined2)uVar16 & 0x1f) - 0xf;
                    CVar27 = 4;
                    if (bVar25 < 4) {
                      CVar27 = *(CTSize *)(&DAT_00157560 + (ulong)bVar25 * 4);
                    }
                  }
                  uVar19 = (ulong)*(ushort *)((long)pIVar13 + uVar19 * 8 + 2);
                  if (*(char *)((long)pIVar13 + uVar19 * 8 + 5) == '\x1c') {
                    lVar26 = *(long *)(ulong)pIVar13[uVar19].field_1.op12;
                  }
                  else {
                    lVar26 = (long)(int)pIVar13[uVar19].field_1.op12;
                  }
                  snap_restoredata(T,ex,uVar17,rfilt,(uint)(pIVar9->field_0).op2,
                                   (void *)(lVar26 + (long)pvVar12),CVar27);
                }
                goto joined_r0x001131cd;
              }
            }
          }
          else {
            if ((pIVar3->field_1).o == 0x4e) {
              t = lj_tab_new(J->L,(uint)(pIVar3->field_0).op1,(uint)(pIVar3->field_0).op2);
            }
            else {
              t = lj_tab_dup(J->L,(GCtab *)(ulong)pIVar18[(pIVar3->field_0).op1].field_1.op12);
            }
            (pTVar14->u32).lo = (uint32_t)t;
            (pTVar14->field_2).it = 0xfffffff4;
            uVar5 = T->snap[uVar17].ref;
            pIVar18 = T->ir;
            pIVar9 = pIVar3;
joined_r0x0011332b:
            pIVar9 = pIVar9 + 1;
            if (pIVar9 < pIVar18 + uVar5) {
              if ((pIVar9->field_1).r == 0xfe) {
                if ((ulong)(pIVar9->field_1).s == 0xff) {
                  uVar16 = (pIVar9->field_1).o - 0x47;
                  if ((4 < uVar16) || (uVar16 == 2)) goto joined_r0x0011332b;
                  pIVar13 = T->ir;
                  uVar19 = (ulong)(pIVar9->field_0).op1;
                  pIVar22 = pIVar13 + uVar19;
                  bVar25 = (pIVar22->field_1).o;
                  if ((bVar25 & 0xfe) == 0x38) {
                    pIVar22 = pIVar13 + (pIVar22->field_0).op1;
                  }
                  if (pIVar13 + (pIVar22->field_0).op1 != pIVar3) goto joined_r0x0011332b;
                }
                else {
                  if (pIVar9 != pIVar3 + (pIVar9->field_1).s) goto joined_r0x0011332b;
                  pIVar13 = T->ir;
                  uVar19 = (ulong)(pIVar9->field_0).op1;
                  bVar25 = *(byte *)((long)pIVar13 + uVar19 * 8 + 5);
                }
                if (bVar25 == 0x3e) {
                  snap_restoreval(J,T,ex,uVar17,rfilt,(uint)(pIVar9->field_0).op2,&local_40);
                  (t->metatable).gcptr32 = (uint32_t)local_40.field_2.field_0;
                }
                else {
                  pIVar22 = pIVar13 + *(ushort *)((long)pIVar13 + uVar19 * 8 + 2);
                  if ((pIVar22->field_1).o == '\x1d') {
                    pIVar22 = pIVar13 + (pIVar22->field_0).op1;
                  }
                  lj_ir_kvalue(J->L,&local_40,pIVar22);
                  pTVar14 = lj_tab_set(J->L,t,&local_40);
                  snap_restoreval(J,T,ex,uVar17,rfilt,(uint)(pIVar9->field_0).op2,pTVar14);
                }
              }
              goto joined_r0x0011332b;
            }
          }
        }
        else {
          snap_restoreval(J,T,ex,uVar17,rfilt,ref,pTVar14);
          if ((uVar16 & 0x30000) != 0) {
            uVar10 = uVar6;
            if (0xffffff < uVar16) {
              uVar10 = *local_50;
              local_50 = local_50 + -1;
            }
            (pTVar14->field_2).it = uVar10;
            L_00->base = pTVar14 + 1;
          }
        }
      }
LAB_0011347c:
      uVar23 = uVar23 + 1;
    } while (uVar23 != uVar24);
  }
  uVar17 = *local_38 - 0x3c;
  if (((uVar17 < 10) && ((0x20bU >> (uVar17 & 0x1f) & 1) != 0)) || (0x54 < *local_38)) {
    puVar15 = &pSVar2->nslots;
  }
  else {
    local_80 = L_00->base;
    puVar15 = (uint8_t *)((ulong)*(uint *)((ulong)local_80[-1].u32.lo + 0x10) - 0x39);
  }
  L_00->top = local_80 + *puVar15;
  *(byte **)((long)ud + 0x10) = local_38;
  return (TValue *)0x0;
}

Assistant:

static TValue *trace_exit_cp(lua_State *L, lua_CFunction dummy, void *ud)
{
  ExitDataCP *exd = (ExitDataCP *)ud;
  cframe_errfunc(L->cframe) = -1;  /* Inherit error function. */
  exd->pc = lj_snap_restore(exd->J, exd->exptr);
  UNUSED(dummy);
  return NULL;
}